

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package_tests.hpp
# Opt level: O2

void __thiscall
pkg1::iutest_typed_test_suite_p_name_PackageTypeParamTest_::A<float>::Body(A<float> *this)

{
  TestSuite *pTVar1;
  char *name;
  AssertionResult iutest_ar;
  iuCodeMessage local_1f0;
  string local_1c0;
  Fixed local_1a0;
  
  pTVar1 = iuutil::GetCurrentTestSuite();
  iuutil::TestSuiteNameRemoveInstantiateAndIndexName_abi_cxx11_
            (&local_1c0,(iuutil *)(pTVar1->m_testsuite_name)._M_dataplus._M_p,name);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"pkg1\" \".\" \"PackageTypeParamTest\"",
             "::iuutil::TestSuiteNameRemoveInstantiateAndIndexName(name)",
             "pkg1.PackageTypeParamTest",(char *)&local_1c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (iutest_ar.m_result == false) {
    memset(&local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/package_tests.hpp"
               ,0x4b,iutest_ar.m_message._M_dataplus._M_p);
    local_1f0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_TYPED_TEST_P(PackageTypeParamTest, A)
    {
        const char* name = ::iuutil::GetCurrentTestSuite()->name();
        IUTEST_EXPECT_PACKAGENAME_(pkg1, PackageTypeParamTest, ::iuutil::TestSuiteNameRemoveInstantiateAndIndexName(name));
    }